

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::EnterScriptEnd(ThreadContext *this,ScriptEntryExitRecord *record,bool doCleanup)

{
  InterruptPoller *pIVar1;
  ScriptContext *pSVar2;
  FunctionEntryPointInfo *pFVar3;
  FunctionEntryPointInfo *pFVar4;
  code *pcVar5;
  bool bVar6;
  DWORD DVar7;
  int iVar8;
  undefined4 *puVar9;
  JavascriptExceptionObject *pJVar10;
  RecyclableData *pRVar11;
  ScriptContext *this_00;
  
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,RunPhase);
  if (bVar6) {
    DVar7 = GetCurrentThreadId();
    Output::Trace(RunPhase,L"%p> EnterScriptEnd  (%p): Level %d\n",(ulong)DVar7,this,
                  (ulong)this->callRootLevel);
    Output::Flush();
  }
  PopEntryExitRecord(this,record);
  if (this->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x5bc,"(this->IsScriptActive())",
                       "Missing EnterScriptStart or LeaveScriptEnd");
    if (!bVar6) goto LAB_007bb3c2;
    *puVar9 = 0;
  }
  this->isScriptActive = false;
  Memory::Recycler::SetIsScriptActive(this->recycler,false);
  this->callRootLevel = this->callRootLevel - 1;
  ExceptionCheck::SetHandledExceptionType(record->handledExceptionType);
  Memory::Recycler::Verify(this->recycler,RunPhase);
  if (this->callRootLevel == 0) {
    Memory::Recycler::SetIsInScript(this->recycler,false);
    pIVar1 = this->interruptPoller;
    if (pIVar1 != (InterruptPoller *)0x0) {
      pIVar1->lastPollTick = 0;
      pIVar1->lastResetTick = 0;
    }
    this_00 = this->rootPendingClose;
    if (this->rootPendingClose != (ScriptContext *)0x0) {
      do {
        pSVar2 = this_00->nextPendingClose;
        Js::ScriptContext::Close(this_00,false);
        this_00 = pSVar2;
      } while (pSVar2 != (ScriptContext *)0x0);
      this->rootPendingClose = (ScriptContext *)0x0;
    }
    if (this->rootPendingClose != (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0x5d1,"(rootPendingClose == nullptr)","rootPendingClose == nullptr");
      if (!bVar6) {
LAB_007bb3c2:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar9 = 0;
    }
    if (this->hasThrownPendingException == true) {
      pJVar10 = GetPendingOOMErrorObject(this);
      Js::JavascriptExceptionObject::ClearError(pJVar10);
      pJVar10 = GetPendingSOErrorObject(this);
      Js::JavascriptExceptionObject::ClearError(pJVar10);
      this->hasThrownPendingException = false;
    }
    Js::DelayedFreeArrayBuffer::ClearAll(&this->delayFreeCallback);
    if (DAT_015b0238 == '\x01') {
      pRVar11 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                          (&this->recyclableData);
      pFVar3 = (pRVar11->oldEntryPointInfo).ptr;
      pRVar11 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                          (&this->recyclableData);
      (pRVar11->oldEntryPointInfo).ptr = (FunctionEntryPointInfo *)0x0;
      while (pFVar3 != (FunctionEntryPointInfo *)0x0) {
        pFVar4 = (pFVar3->nextEntryPoint).ptr;
        (pFVar3->nextEntryPoint).ptr = (FunctionEntryPointInfo *)0x0;
        pFVar3 = pFVar4;
      }
    }
    if (!doCleanup) {
      return;
    }
    if ((this->threadServiceWrapper == (ThreadServiceWrapper *)0x0) ||
       (iVar8 = (**this->threadServiceWrapper->_vptr_ThreadServiceWrapper)(), (char)iVar8 == '\0'))
    {
      Memory::Recycler::CollectNow<(Memory::CollectionFlags)2449477633>(this->recycler);
    }
    Memory::Recycler::LeaveIdleDecommit(this->recycler);
  }
  if (!doCleanup) {
    return;
  }
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DisposePhase);
  if (bVar6) {
    Output::Print(L"[Dispose] NeedDispose in EnterScriptEnd: %d\n",
                  (ulong)this->recycler->hasDisposableObject);
    Output::Flush();
  }
  Memory::Recycler::FinishDisposeObjectsNow<(Memory::CollectionFlags)32768>(this->recycler);
  return;
}

Assistant:

void
ThreadContext::EnterScriptEnd(Js::ScriptEntryExitRecord * record, bool doCleanup)
{
#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::RunPhase))
    {
        Output::Trace(Js::RunPhase, _u("%p> EnterScriptEnd  (%p): Level %d\n"), ::GetCurrentThreadId(), this, this->callRootLevel);
        Output::Flush();
    }
#endif
    this->PopEntryExitRecord(record);
    AssertMsg(this->IsScriptActive(),
              "Missing EnterScriptStart or LeaveScriptEnd");
    this->isScriptActive = false;
    this->GetRecycler()->SetIsScriptActive(false);
    this->callRootLevel--;
#ifdef EXCEPTION_CHECK
    ExceptionCheck::SetHandledExceptionType(record->handledExceptionType);
#endif
#ifdef RECYCLER_MEMORY_VERIFY
    recycler->Verify(Js::RunPhase);
#endif

    if (this->callRootLevel == 0)
    {
        RECORD_TIMESTAMP(lastScriptEndTime);
        this->GetRecycler()->SetIsInScript(false);
        InterruptPoller *poller = this->interruptPoller;
        if (poller)
        {
            poller->EndScript();
        }
        ClosePendingScriptContexts();
        Assert(rootPendingClose == nullptr);

        if (this->hasThrownPendingException)
        {
            // We have some cases where the thread instant of JavascriptExceptionObject
            // are ignored and not clear. To avoid leaks, clear it here when
            // we are not in script, where no one should be using these JavascriptExceptionObject
            this->ClearPendingOOMError();
            this->ClearPendingSOError();
            this->hasThrownPendingException = false;
        }

        delayFreeCallback.ClearAll();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.FreeRejittedCode)
#endif
        {
            // Since we're no longer in script, old entry points can now be collected
            Js::FunctionEntryPointInfo* current = this->recyclableData->oldEntryPointInfo;
            this->recyclableData->oldEntryPointInfo = nullptr;

            // Clear out the next pointers so older entry points wont be held on
            // as a false positive

            while (current != nullptr)
            {
                Js::FunctionEntryPointInfo* next = current->nextEntryPoint;
                current->nextEntryPoint = nullptr;
                current = next;
            }
        }

        if (doCleanup)
        {
            ThreadServiceWrapper* threadServiceWrapper = GetThreadServiceWrapper();
            if (!threadServiceWrapper || !threadServiceWrapper->ScheduleNextCollectOnExit())
            {
                // Do the idle GC now if we fail schedule one.
                recycler->CollectNow<CollectOnScriptExit>();
            }
            recycler->LeaveIdleDecommit();
        }
    }

    if (doCleanup)
    {
        PHASE_PRINT_TRACE1(Js::DisposePhase, _u("[Dispose] NeedDispose in EnterScriptEnd: %d\n"), this->recycler->NeedDispose());
        this->recycler->FinishDisposeObjectsNow<FinishDispose>();
    }

    JS_ETW_INTERNAL(EventWriteJSCRIPT_RUN_STOP(this,0));
}